

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<unsigned_long> * __thiscall
tcb::rational<unsigned_long>::operator*=
          (rational<unsigned_long> *this,rational<unsigned_long> *other)

{
  this->num_ = this->num_ * other->num_;
  this->denom_ = this->denom_ * other->denom_;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator*=(const rational<U>& other)
    {
        num_ *= other.num();
        denom_ *= other.denom();
        simplify();
        return *this;
    }